

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_oarchive.h
# Opt level: O3

void __thiscall serialization::xml_oarchive::save(xml_oarchive *this,int v)

{
  xml_node<char> *pxVar1;
  char *pcVar2;
  char *pcVar3;
  uint64_t value;
  char buffer [64];
  char local_68;
  char local_67 [71];
  
  pcVar2 = &local_68;
  value = (uint64_t)v;
  if (v < 0) {
    pcVar2 = local_67;
    local_68 = '-';
    value = -value;
  }
  pcVar2 = rapidjson::internal::u64toa(value,pcVar2);
  pxVar1 = this->current_;
  pcVar3 = rapidxml::memory_pool<char>::allocate_string
                     (&(this->document_).super_memory_pool<char>,&local_68,
                      (long)pcVar2 - (long)&local_68);
  (pxVar1->super_xml_base<char>).m_value = pcVar3;
  (pxVar1->super_xml_base<char>).m_value_size = (long)pcVar2 - (long)&local_68;
  return;
}

Assistant:

void save(int v)
	{
		char buffer[64];
		const char* end = rapidjson::internal::i64toa(v, buffer);
        current_->value(document_.allocate_string(buffer, end - buffer), end - buffer);
	}